

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  int iVar1;
  long lVar2;
  long extraout_RAX;
  string *psVar3;
  long in_RCX;
  LogMessage aLStack_18 [16];
  
  if (count == 0) {
    WriteBuffer(this);
    return;
  }
  if (count < 0) {
    BackUp();
    lVar2 = extraout_RAX;
  }
  else {
    iVar1 = this->buffer_used_;
    lVar2 = (long)iVar1;
    in_RCX = (long)this->buffer_size_;
    if (iVar1 == this->buffer_size_) {
      if (count <= iVar1) {
        this->buffer_used_ = iVar1 - count;
        return;
      }
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)(uint)count,lVar2,"count <= buffer_used_");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)aLStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x13f,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (aLStack_18,
                 (char (*) [78])
                 " Can\'t back up over more bytes than were returned by the last call to Next().");
      goto LAB_002b565e;
    }
  }
  psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     (lVar2,in_RCX,"buffer_used_ == buffer_size_");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x13d,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
  absl::lts_20240722::log_internal::LogMessage::operator<<
            (aLStack_18,(char (*) [43])" BackUp() can only be called after Next().");
LAB_002b565e:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_18)
  ;
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  if (count == 0) {
    Flush();
    return;
  }
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}